

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::getBasicPrimalInfeasibility(HEkkPrimal *this)

{
  double dVar1;
  double dVar2;
  HEkk *pHVar3;
  HighsInt iRow;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  iVar5 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x20,0);
  pHVar3 = this->ekk_instance_;
  dVar1 = (pHVar3->options_->super_HighsOptionsStruct).primal_feasibility_tolerance;
  (pHVar3->info_).num_primal_infeasibilities = 0;
  (pHVar3->info_).max_primal_infeasibility = 0.0;
  (pHVar3->info_).sum_primal_infeasibilities = 0.0;
  dVar6 = 0.0;
  dVar7 = 0.0;
  lVar4 = 0;
  do {
    if (this->num_row <= lVar4) {
      HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x20,0);
      return;
    }
    dVar2 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
    dVar8 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
    if (dVar8 - dVar1 <= dVar2) {
      dVar8 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[lVar4];
      if (dVar1 + dVar8 < dVar2) {
        dVar8 = dVar2 - dVar8;
        goto LAB_003454f3;
      }
    }
    else {
      dVar8 = dVar8 - dVar2;
LAB_003454f3:
      if (0.0 < dVar8) {
        if (dVar1 < dVar8) {
          iVar5 = iVar5 + 1;
          (pHVar3->info_).num_primal_infeasibilities = iVar5;
        }
        if (dVar7 <= dVar8) {
          dVar7 = dVar8;
        }
        (pHVar3->info_).max_primal_infeasibility = dVar7;
        dVar6 = dVar6 + dVar8;
        (pHVar3->info_).sum_primal_infeasibilities = dVar6;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void HEkkPrimal::getBasicPrimalInfeasibility() {
  // Gets the num/max/sum of basic primal infeasibilities,
  analysis->simplexTimerStart(ComputePrIfsClock);
  const double primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsInt& num_primal_infeasibility = info.num_primal_infeasibilities;
  double& max_primal_infeasibility = info.max_primal_infeasibility;
  double& sum_primal_infeasibility = info.sum_primal_infeasibilities;
  const HighsInt updated_num_primal_infeasibility = num_primal_infeasibility;
  num_primal_infeasibility = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibility = 0;

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double value = info.baseValue_[iRow];
    double lower = info.baseLower_[iRow];
    double upper = info.baseUpper_[iRow];
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (value < lower - primal_feasibility_tolerance) {
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      primal_infeasibility = value - upper;
    }
    if (primal_infeasibility > 0) {
      if (primal_infeasibility > primal_feasibility_tolerance)
        num_primal_infeasibility++;
      max_primal_infeasibility =
          std::max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibility += primal_infeasibility;
    }
  }
  if (updated_num_primal_infeasibility >= 0) {
    // The number of primal infeasibilities should be correct
    bool num_primal_infeasibility_ok =
        num_primal_infeasibility == updated_num_primal_infeasibility;
    // if (!num_primal_infeasibility_ok)
    //   printf("In iteration %" HIGHSINT_FORMAT
    //          ": num_primal_infeasibility = %" HIGHSINT_FORMAT
    //          " != %" HIGHSINT_FORMAT
    //          " = "
    //          "updated_num_primal_infeasibility\n",
    //          ekk_instance_.iteration_count_, num_primal_infeasibility,
    //          updated_num_primal_infeasibility);

    assert(num_primal_infeasibility_ok);
  }
  analysis->simplexTimerStop(ComputePrIfsClock);
}